

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O1

void __thiscall helics::CustomMessageOperator::~CustomMessageOperator(CustomMessageOperator *this)

{
  _Manager_type p_Var1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__CustomMessageOperator_004e0bd8;
  p_Var1 = (this->messageFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->messageFunction,(_Any_data *)&this->messageFunction,
              __destroy_functor);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

class HELICS_CXX_EXPORT CustomMessageOperator: public FilterOperator {
  public:
    /** default constructor*/
    CustomMessageOperator() = default;
    /** set the function to modify the data of the message in the constructor*/
    explicit CustomMessageOperator(
        std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction);
    /** set the function to modify the data of the message*/
    void setMessageFunction(
        std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction);

  private:
    std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)>
        messageFunction;  //!< the function actually doing the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}